

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void * alloc_buf_for_readahead(void)

{
  int iVar1;
  void *ret;
  void *local_8;
  
  local_8 = (void *)0x0;
  if ((global_config.num_blocks_readahead == 0) ||
     (iVar1 = posix_memalign(&local_8,0x200,
                             (ulong)(global_config.num_blocks_readahead * global_config.blocksize)),
     iVar1 != 0)) {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* alloc_buf_for_readahead() {
    void* ret = nullptr;
    if (!global_config.num_blocks_readahead) return ret;

    malloc_align( ret,
                  FDB_SECTOR_SIZE,
                  global_config.blocksize * global_config.num_blocks_readahead );
    return ret;
}